

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O1

void __thiscall iqxmlrpc::http::Header::parse(Header *this,string *s)

{
  char *pcVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>
  _Var2;
  mapped_type *pmVar3;
  Malformed_packet *this_00;
  char *pcVar4;
  size_type sVar5;
  _Elt_pointer pbVar6;
  const_iterator i;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  pointer pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>_>
  pVar12;
  string opt_name;
  string opt_value;
  Tokens lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  locale local_f0;
  _Map_pointer local_e8;
  _Elt_pointer local_e0;
  _Elt_pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Options *local_b0;
  Validators *local_a8;
  anon_union_16_2_ba345be5_for_m_Storage local_a0;
  ulong local_90;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  local_120._M_dataplus._M_p = "\r\n";
  local_120._M_string_length = (long)&names::crlf + 2;
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_a0,(iterator_range<const_char_*> *)&local_120);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88,s,(is_any_ofF<char> *)&local_a0,token_compress_on);
  if ((0x10 < local_90) && (local_a0.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_a0.m_dynSet);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::_M_assign((string *)&this->head_line_);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_e0 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
    local_e8 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
    local_a8 = &this->validators_;
    local_b0 = &this->options_;
    pbVar6 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    do {
      paVar11 = &local_120.field_2;
      pcVar4 = (pbVar6->_M_dataplus)._M_p;
      sVar5 = pbVar6->_M_string_length;
      pcVar1 = pcVar4 + sVar5;
      for (; pcVar7 = pcVar1, pcVar8 = pcVar1, sVar5 != 0; sVar5 = sVar5 - 1) {
        if (*pcVar4 == ':') {
          pcVar7 = pcVar4 + 1;
          pcVar8 = pcVar4;
          break;
        }
        pcVar4 = pcVar4 + 1;
      }
      if (pcVar8 == pcVar1) {
        this_00 = (Malformed_packet *)__cxa_allocate_exception(0x18);
        local_120._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,"option line does not contain a colon symbol","");
        Malformed_packet::Malformed_packet(this_00,&local_120);
        __cxa_throw(this_00,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
      }
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      lVar9 = (long)pcVar8 - (long)(pbVar6->_M_dataplus)._M_p;
      local_120._M_dataplus._M_p = (pointer)paVar11;
      local_d8 = pbVar6;
      if (0 < lVar9) {
        lVar9 = lVar9 + 1;
        do {
          std::__cxx11::string::push_back((char)&local_120);
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      pcVar10 = (local_d8->_M_dataplus)._M_p + (local_d8->_M_string_length - (long)pcVar7);
      if (0 < (long)pcVar10) {
        pcVar10 = pcVar10 + 1;
        do {
          std::__cxx11::string::push_back((char)&local_d0);
          pcVar10 = pcVar10 + -1;
        } while (1 < (long)pcVar10);
      }
      std::locale::locale((locale *)local_100);
      local_f8._0_2_ = 0x2000;
      std::locale::locale(&local_f0,(locale *)local_100);
      boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                (&local_120,(is_classifiedF *)&local_f8);
      std::locale::~locale(&local_f0);
      std::locale::~locale((locale *)local_100);
      std::locale::locale((locale *)local_100);
      local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT62(local_f8._2_6_,0x2000);
      std::locale::locale(&local_f0,(locale *)local_100);
      boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                (&local_d0,(is_classifiedF *)&local_f8);
      std::locale::~locale(&local_f0);
      std::locale::~locale((locale *)local_100);
      std::locale::locale((locale *)local_100);
      local_f0._M_impl = (_Impl *)(local_120._M_dataplus._M_p + local_120._M_string_length);
      local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_120._M_dataplus._M_p;
      boost::algorithm::detail::
      transform_range<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::to_lowerF<char>>
                ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8,(locale *)local_100);
      std::locale::~locale((locale *)local_100);
      pVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>_>_>
               ::equal_range(&local_a8->_M_t,&local_120);
      for (_Var2 = pVar12.first._M_node; _Var2._M_node != pVar12.second._M_node._M_node;
          _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node)) {
        if ((int)_Var2._M_node[2]._M_color <= (int)this->ver_level_) {
          boost::
          function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::operator()((function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&_Var2._M_node[2]._M_parent,&local_d0);
        }
      }
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_b0,&local_120);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      pbVar6 = local_d8 + 1;
      if (pbVar6 == local_e0) {
        pbVar6 = local_e8[1];
        local_e8 = local_e8 + 1;
        local_e0 = pbVar6 + 0x10;
      }
    } while (pbVar6 != local_88._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void Header::parse(const std::string& s)
{
  typedef std::deque<std::string> Tokens;
  Tokens lines;
  boost::split(lines, s, boost::is_any_of(names::crlf), boost::token_compress_on);

  if (!lines.empty()) {
    head_line_ = lines.front();
    lines.pop_front();
  }

  for (Tokens::iterator i = lines.begin(); i != lines.end(); ++i) {
    boost::iterator_range<std::string::iterator> j = boost::find_first(*i, ":");
    if (j.begin() == i->end())
      throw Malformed_packet("option line does not contain a colon symbol");

    std::string opt_name, opt_value;
    std::copy(i->begin(), j.begin(), std::back_inserter(opt_name));
    std::copy(j.end(), i->end(), std::back_inserter(opt_value));

    boost::trim(opt_name);
    boost::trim(opt_value);
    boost::to_lower(opt_name);
    set_option_checked(opt_name, opt_value);
  }
}